

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::MethodDescriptorProto::ByteSizeLong(MethodDescriptorProto *this)

{
  uint uVar1;
  uint32_t *puVar2;
  string *psVar3;
  size_t sVar4;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  MethodDescriptorProto *this_local;
  
  sStack_18 = 0;
  puVar2 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar2;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = _internal_name_abi_cxx11_(this);
      sStack_18 = internal::WireFormatLite::StringSize(psVar3);
      sStack_18 = sStack_18 + 1;
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = _internal_input_type_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
    if ((uVar1 & 4) != 0) {
      psVar3 = _internal_output_type_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(psVar3);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
    if ((uVar1 & 8) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::MethodOptions>(this->options_)
      ;
      sStack_18 = sVar4 + 1 + sStack_18;
    }
    if ((uVar1 & 0x10) != 0) {
      sStack_18 = sStack_18 + 2;
    }
    if ((uVar1 & 0x20) != 0) {
      sStack_18 = sStack_18 + 2;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar4;
}

Assistant:

size_t MethodDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MethodDescriptorProto)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string input_type = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input_type());
    }

    // optional string output_type = 3;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_output_type());
    }

    // optional .google.protobuf.MethodOptions options = 4;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional bool client_streaming = 5 [default = false];
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 + 1;
    }

    // optional bool server_streaming = 6 [default = false];
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 1;
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}